

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void wabt::WriteFloatHex(char *buffer,size_t size,uint32_t bits)

{
  uint32_t bits_local;
  size_t size_local;
  char *buffer_local;
  
  anon_unknown_0::FloatWriter<float>::WriteHex(buffer,size,bits);
  return;
}

Assistant:

void WriteFloatHex(char* buffer, size_t size, uint32_t bits) {
  return FloatWriter<float>::WriteHex(buffer, size, bits);
}